

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::~UnitTestImpl(UnitTestImpl *this)

{
  pointer ppTVar1;
  pointer ppEVar2;
  DeathTestFactory *pDVar3;
  TestEventRepeater *pTVar4;
  pointer piVar5;
  pointer pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer ppTVar8;
  pointer ppEVar9;
  
  this->_vptr_UnitTestImpl = (_func_int **)&PTR__UnitTestImpl_00acc620;
  ppTVar1 = (this->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar8 = (this->test_cases_).
                 super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppTVar8 != ppTVar1; ppTVar8 = ppTVar8 + 1
      ) {
    if (*ppTVar8 != (TestCase *)0x0) {
      (*(*ppTVar8)->_vptr_TestCase[1])();
    }
  }
  ppEVar2 = (this->environments_).
            super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar9 = (this->environments_).
                 super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppEVar9 != ppEVar2;
      ppEVar9 = ppEVar9 + 1) {
    if (*ppEVar9 != (Environment *)0x0) {
      (**(code **)(*(long *)*ppEVar9 + 8))();
    }
  }
  if (this->os_stack_trace_getter_ != (OsStackTraceGetterInterface *)0x0) {
    (*this->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface[1])();
  }
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  ::~ThreadLocal(&this->gtest_trace_stack_);
  pDVar3 = (this->death_test_factory_).ptr_;
  if (pDVar3 != (DeathTestFactory *)0x0) {
    (*pDVar3->_vptr_DeathTestFactory[1])();
    (this->death_test_factory_).ptr_ = (DeathTestFactory *)0x0;
  }
  scoped_ptr<testing::internal::InternalRunDeathTestFlag>::reset
            (&this->internal_run_death_test_flag_,(InternalRunDeathTestFlag *)0x0);
  pTVar4 = (this->listeners_).repeater_;
  if (pTVar4 != (TestEventRepeater *)0x0) {
    (*(pTVar4->super_TestEventListener)._vptr_TestEventListener[1])();
  }
  std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::~vector
            (&(this->ad_hoc_test_result_).test_properties_);
  std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::~vector
            (&(this->ad_hoc_test_result_).test_part_results_);
  Mutex::~Mutex(&(this->ad_hoc_test_result_).test_properites_mutex_);
  ParameterizedTestCaseRegistry::~ParameterizedTestCaseRegistry(&this->parameterized_test_registry_)
  ;
  piVar5 = (this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5,(long)(this->test_case_indices_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar5);
  }
  ppTVar8 = (this->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar8 != (pointer)0x0) {
    operator_delete(ppTVar8,(long)(this->test_cases_).
                                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar8
                   );
  }
  ppEVar9 = (this->environments_).
            super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar9 != (pointer)0x0) {
    operator_delete(ppEVar9,(long)(this->environments_).
                                  super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar9
                   );
  }
  ThreadLocal<testing::TestPartResultReporterInterface_*>::~ThreadLocal
            (&this->per_thread_test_part_result_reporter_);
  Mutex::~Mutex(&this->global_test_part_result_reporter_mutex_);
  pcVar6 = (this->original_working_dir_).pathname_._M_dataplus._M_p;
  paVar7 = &(this->original_working_dir_).pathname_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != paVar7) {
    operator_delete(pcVar6,paVar7->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

UnitTestImpl::~UnitTestImpl() {
  // Deletes every TestCase.
  ForEach(test_cases_, internal::Delete<TestCase>);

  // Deletes every Environment.
  ForEach(environments_, internal::Delete<Environment>);

  delete os_stack_trace_getter_;
}